

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_free(archive *_a)

{
  int iVar1;
  void *in_RDI;
  wchar_t magic_test;
  archive_match *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = L'\0';
  }
  else {
    iVar1 = __archive_check_magic
                      (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
    if (iVar1 == -0x1e) {
      local_4 = L'\xffffffe2';
    }
    else {
      match_list_free((match_list *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      match_list_free((match_list *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      entry_list_free((entry_list *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      free(*(void **)((long)in_RDI + 0x168));
      free(*(void **)((long)in_RDI + 0x180));
      match_list_free((match_list *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      match_list_free((match_list *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
      free(in_RDI);
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

int
archive_match_free(struct archive *_a)
{
	struct archive_match *a;

	if (_a == NULL)
		return (ARCHIVE_OK);
	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_ANY | ARCHIVE_STATE_FATAL, "archive_match_free");
	a = (struct archive_match *)_a;
	match_list_free(&(a->inclusions));
	match_list_free(&(a->exclusions));
	entry_list_free(&(a->exclusion_entry_list));
	free(a->inclusion_uids.ids);
	free(a->inclusion_gids.ids);
	match_list_free(&(a->inclusion_unames));
	match_list_free(&(a->inclusion_gnames));
	free(a);
	return (ARCHIVE_OK);
}